

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftmgr.c
# Opt level: O2

void free_ftmgr(ftmgr **ftmgr)

{
  ftmgr *__ptr;
  long lVar1;
  
  __ptr = *ftmgr;
  *ftmgr = (ftmgr *)0x0;
  for (lVar1 = 0x40; lVar1 != 0x100; lVar1 = lVar1 + 0x18) {
    free(*(void **)((long)__ptr->ftq + lVar1 + -0x38));
  }
  if (__ptr->fd != -1) {
    close(__ptr->fd);
  }
  free(__ptr);
  return;
}

Assistant:

void free_ftmgr(struct ftmgr **ftmgr)
{
    struct ftmgr *ft = *ftmgr;
    *ftmgr = NULL;
    for(int i = 0;i < FTQ_NR;i++) {
        free(ft->ftq[i].blk);
    }
    if(ft->fd != -1)
        close(ft->fd);
    free(ft);
}